

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::php::anon_unknown_2::ReservedNamePrefix
          (string *__return_storage_ptr__,anon_unknown_2 *this,string *classname,
          FileDescriptor *file)

{
  undefined1 *puVar1;
  int iVar2;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  string *extraout_RAX_02;
  string *psVar3;
  long lVar4;
  string lower;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,this,this + (long)&classname->_M_dataplus);
  puVar1 = local_50;
  if (local_48 != 0) {
    lVar4 = 0;
    do {
      iVar2 = tolower((int)(char)puVar1[lVar4]);
      puVar1[lVar4] = (char)iVar2;
      lVar4 = lVar4 + 1;
    } while (local_48 != lVar4);
  }
  lVar4 = 0;
  do {
    iVar2 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar2 == 0) {
      iVar2 = std::__cxx11::string::compare(*(char **)(file + 8));
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (iVar2 == 0) {
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"GPB","");
        psVar3 = extraout_RAX_01;
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"PB","");
        psVar3 = extraout_RAX_00;
      }
      goto LAB_002763c3;
    }
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x268);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  psVar3 = extraout_RAX;
LAB_002763c3:
  if (local_50 != local_40) {
    operator_delete(local_50);
    psVar3 = extraout_RAX_02;
  }
  return psVar3;
}

Assistant:

std::string ReservedNamePrefix(const std::string& classname,
                                const FileDescriptor* file) {
  bool is_reserved = false;

  std::string lower = classname;
  std::transform(lower.begin(), lower.end(), lower.begin(), ::tolower);

  for (int i = 0; i < kReservedNamesSize; i++) {
    if (lower == kReservedNames[i]) {
      is_reserved = true;
      break;
    }
  }

  if (is_reserved) {
    if (file->package() == "google.protobuf") {
      return "GPB";
    } else {
      return "PB";
    }
  }

  return "";
}